

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS ref_inflate_extend_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_78;
  double local_68;
  int local_5c;
  REF_INT i;
  REF_DBL dp;
  REF_DBL dz;
  REF_DBL dy;
  REF_DBL l;
  REF_DBL dx;
  REF_DBL *phi_local;
  REF_DBL *yz_local;
  REF_DBL *x_local;
  REF_INT *n_local;
  
  if (1 < *n) {
    dVar7 = (x[*n + -1] - *x) * 0.25;
    dVar8 = x[1] - *x;
    dVar9 = yz[2];
    dVar1 = *yz;
    dVar2 = yz[3];
    dVar3 = yz[1];
    dVar4 = phi[1];
    dVar5 = *phi;
    iVar6 = *n;
    while (local_5c = iVar6 + -1, -1 < local_5c) {
      x[iVar6] = x[local_5c];
      yz[iVar6 * 2] = yz[local_5c * 2];
      yz[iVar6 * 2 + 1] = yz[local_5c * 2 + 1];
      phi[iVar6] = phi[local_5c];
      iVar6 = local_5c;
    }
    *n = *n + 1;
    *x = x[1] - dVar7;
    *yz = -(dVar9 - dVar1) * (dVar7 / dVar8) + yz[2];
    yz[1] = -(dVar2 - dVar3) * (dVar7 / dVar8) + yz[3];
    *phi = -(dVar4 - dVar5) * (dVar7 / dVar8) + phi[1];
    dVar9 = x[*n + -1] - x[*n + -2];
    if (dVar9 * 1e+20 <= 0.0) {
      local_68 = -(dVar9 * 1e+20);
    }
    else {
      local_68 = dVar9 * 1e+20;
    }
    local_78 = dVar7;
    if (dVar7 <= 0.0) {
      local_78 = -dVar7;
    }
    if (local_78 < local_68) {
      x[*n] = x[*n + -1] + dVar7;
      yz[*n << 1] = (yz[(*n + -1) * 2] - yz[(*n + -2) * 2]) * (dVar7 / dVar9) + yz[(*n + -1) * 2];
      yz[*n * 2 + 1] =
           (yz[(*n + -1) * 2 + 1] - yz[(*n + -2) * 2 + 1]) * (dVar7 / dVar9) + yz[(*n + -1) * 2 + 1]
      ;
      phi[*n] = (phi[*n + -1] - phi[*n + -2]) * (dVar7 / dVar9) + phi[*n + -1];
      *n = *n + 1;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_extend_rail(REF_INT *n, REF_DBL *x,
                                                  REF_DBL *yz, REF_DBL *phi) {
  REF_DBL dx, l, dy, dz, dp;
  REF_INT i;
  if (2 > *n) return REF_SUCCESS;

  l = x[(*n) - 1] - x[0];
  l = 0.25 * l;

  dx = x[1] - x[0];
  dy = yz[0 + 2 * 1] - yz[0 + 2 * 0];
  dz = yz[1 + 2 * 1] - yz[1 + 2 * 0];
  dp = phi[1] - phi[0];

  /* shift to add first node */
  for (i = (*n) - 1; i >= 0; i--) {
    x[i + 1] = x[i];
    yz[0 + 2 * (i + 1)] = yz[0 + 2 * (i)];
    yz[1 + 2 * (i + 1)] = yz[1 + 2 * (i)];
    phi[(i + 1)] = phi[(i)];
  }
  (*n)++;

  x[0] = x[1] - l;
  yz[0 + 2 * 0] = yz[0 + 2 * 1] - dy * (l / dx);
  yz[1 + 2 * 0] = yz[1 + 2 * 1] - dz * (l / dx);
  phi[0] = phi[1] - dp * (l / dx);

  dx = x[(*n) - 1] - x[(*n) - 2];
  if (ref_math_divisible(l, dx)) {
    x[(*n)] = x[(*n) - 1] + l;

    dy = yz[0 + 2 * ((*n) - 1)] - yz[0 + 2 * ((*n) - 2)];
    yz[0 + 2 * (*n)] = yz[0 + 2 * ((*n) - 1)] + dy * (l / dx);

    dz = yz[1 + 2 * ((*n) - 1)] - yz[1 + 2 * ((*n) - 2)];
    yz[1 + 2 * (*n)] = yz[1 + 2 * ((*n) - 1)] + dz * (l / dx);

    dp = phi[((*n) - 1)] - phi[((*n) - 2)];
    phi[(*n)] = phi[((*n) - 1)] + dp * (l / dx);

    (*n)++;
  }
  return REF_SUCCESS;
}